

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CodeBlockProd * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol::CodeBlockProd,slang::ast::StatementBlockSymbol_const&>
          (BumpAllocator *this,StatementBlockSymbol *args)

{
  CodeBlockProd *pCVar1;
  StatementBlockSymbol *in_RDI;
  CodeBlockProd *unaff_retaddr;
  
  pCVar1 = (CodeBlockProd *)allocate((BumpAllocator *)args,(size_t)unaff_retaddr,(size_t)in_RDI);
  ast::RandSeqProductionSymbol::CodeBlockProd::CodeBlockProd(unaff_retaddr,in_RDI);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }